

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O3

int __thiscall
CVmObjFrameDesc::getp_is_active(CVmObjFrameDesc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uint uVar1;
  int iVar2;
  
  if (getp_is_active(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_is_active();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_is_active::desc);
  if (iVar2 == 0) {
    uVar1 = *(uint *)(this->super_CVmObject).ext_;
    retval->typ = VM_TRUE - (**(long **)((long)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].
                                                ptr_ + 8) == 0);
  }
  return 1;
}

Assistant:

int CVmObjFrameDesc::getp_is_active(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                    uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* the frame is valid if we still have a frame pointer */
    retval->set_logical(get_frame_ref(vmg0_)->is_active());

    /* handled */
    return TRUE;
}